

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O2

size_t ZSTD_decompressSequences_bmi2
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset)

{
  BYTE *pBVar1;
  byte bVar2;
  byte bVar3;
  BYTE BVar4;
  uint uVar5;
  BYTE *base;
  seq_t sequence;
  ZSTD_DCtx *pZVar6;
  BIT_DStream_status BVar7;
  uint uVar8;
  uint uVar9;
  BYTE *op;
  long lVar10;
  size_t sVar11;
  ulong uVar12;
  BYTE *pBVar13;
  BYTE *pBVar14;
  int iVar15;
  BYTE *oend_00;
  BYTE *pBVar16;
  BYTE *op_00;
  BYTE *oend;
  BYTE *pBVar17;
  BYTE *ip_1;
  BYTE *litLimit;
  ulong uVar18;
  BYTE *pBStackY_170;
  BYTE *litPtr;
  ZSTD_DCtx *local_108;
  BYTE *local_100;
  BYTE *local_f8;
  BYTE *local_f0;
  seqState_t seqState;
  size_t sStack_48;
  BYTE *pBStack_38;
  
  oend_00 = (BYTE *)(maxDstSize + (long)dst);
  litPtr = dctx->litPtr;
  litLimit = litPtr + dctx->litSize;
  op_00 = (BYTE *)dst;
  if (nbSeq == 0) {
LAB_0013ba4e:
    uVar18 = (long)litLimit - (long)litPtr;
    if ((ulong)((long)oend_00 - (long)op_00) < uVar18) {
LAB_0013ba59:
      pBStackY_170 = (BYTE *)0xffffffffffffffba;
    }
    else {
      memcpy(op_00,litPtr,uVar18);
      pBStackY_170 = op_00 + (uVar18 - (long)dst);
    }
  }
  else {
    base = (BYTE *)dctx->prefixStart;
    local_f8 = (BYTE *)dctx->virtualStart;
    local_100 = (BYTE *)dctx->dictEnd;
    dctx->fseEntropy = 1;
    for (lVar10 = -0xc; lVar10 != 0; lVar10 = lVar10 + 4) {
      *(ulong *)((long)seqState.prevOffset + lVar10 * 2 + 0x18) =
           (ulong)*(uint *)((long)dctx->workspace + lVar10);
    }
    local_108 = dctx;
    sVar11 = BIT_initDStream(&seqState.DStream,seqStart,seqSize);
    pZVar6 = local_108;
    if (sVar11 < 0xffffffffffffff89) {
      ZSTD_initFseState(&seqState.stateLL,&seqState.DStream,local_108->LLTptr);
      ZSTD_initFseState(&seqState.stateOffb,&seqState.DStream,pZVar6->OFTptr);
      ZSTD_initFseState(&seqState.stateML,&seqState.DStream,pZVar6->MLTptr);
      local_f0 = oend_00 + -8;
      do {
        BVar7 = BIT_reloadDStream(&seqState.DStream);
        if ((BVar7 == BIT_DStream_overflow) || (nbSeq == 0)) {
          if (nbSeq != 0) {
            return 0xffffffffffffffec;
          }
          BVar7 = BIT_reloadDStream(&seqState.DStream);
          if (BVar7 < BIT_DStream_completed) {
            return 0xffffffffffffffec;
          }
          for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
            (local_108->entropy).rep[lVar10] = (U32)seqState.prevOffset[lVar10];
          }
          goto LAB_0013ba4e;
        }
        bVar2 = seqState.stateOffb.table[seqState.stateOffb.state].nbAdditionalBits;
        uVar9 = seqState.stateLL.table[seqState.stateLL.state].baseValue;
        uVar8 = (uint)bVar2;
        if (bVar2 == 0) {
          sVar11 = 0;
LAB_0013b5b2:
          lVar10 = ((ulong)uVar9 == 0) + sVar11;
          if (lVar10 != 0) {
            if (lVar10 == 3) {
              sVar11 = (seqState.prevOffset[0] - 1) + (ulong)(seqState.prevOffset[0] == 1);
            }
            else {
              sVar11 = seqState.prevOffset[lVar10] + (ulong)(seqState.prevOffset[lVar10] == 0);
              if (lVar10 == 1) goto LAB_0013b61c;
            }
            seqState.prevOffset[2] = seqState.prevOffset[1];
            goto LAB_0013b61c;
          }
        }
        else {
          sVar11 = ((seqState.DStream.bitContainer << ((ulong)seqState.DStream.bitsConsumed & 0x3f))
                   >> ((ulong)(byte)-bVar2 & 0x3f)) +
                   (ulong)seqState.stateOffb.table[seqState.stateOffb.state].baseValue;
          seqState.DStream.bitsConsumed = seqState.DStream.bitsConsumed + uVar8;
          if (uVar8 == 1) goto LAB_0013b5b2;
          seqState.prevOffset[2] = seqState.prevOffset[1];
LAB_0013b61c:
          seqState.prevOffset[1] = seqState.prevOffset[0];
          seqState.prevOffset[0] = sVar11;
        }
        sVar11 = seqState.prevOffset[0];
        bVar2 = seqState.stateML.table[seqState.stateML.state].nbAdditionalBits;
        if (bVar2 == 0) {
          uVar18 = 0;
        }
        else {
          uVar18 = (seqState.DStream.bitContainer << ((ulong)seqState.DStream.bitsConsumed & 0x3f))
                   >> ((ulong)(byte)-bVar2 & 0x3f);
          seqState.DStream.bitsConsumed = seqState.DStream.bitsConsumed + bVar2;
        }
        bVar3 = seqState.stateLL.table[seqState.stateLL.state].nbAdditionalBits;
        uVar5 = seqState.stateML.table[seqState.stateML.state].baseValue;
        if (0x1e < (uint)bVar2 + (uint)bVar3 + uVar8) {
          BIT_reloadDStream(&seqState.DStream);
        }
        if (bVar3 == 0) {
          uVar12 = 0;
        }
        else {
          uVar12 = (seqState.DStream.bitContainer << ((ulong)seqState.DStream.bitsConsumed & 0x3f))
                   >> ((ulong)(byte)-bVar3 & 0x3f);
          seqState.DStream.bitsConsumed = seqState.DStream.bitsConsumed + bVar3;
        }
        sStack_48 = uVar18 + uVar5;
        uVar12 = uVar12 + uVar9;
        iVar15 = seqState.DStream.bitsConsumed +
                 seqState.stateLL.table[seqState.stateLL.state].nbBits;
        seqState.stateLL.state =
             (ulong)((uint)(seqState.DStream.bitContainer >> ((ulong)(byte)-(char)iVar15 & 0x3f)) &
                    BIT_mask[seqState.stateLL.table[seqState.stateLL.state].nbBits]) +
             (ulong)seqState.stateLL.table[seqState.stateLL.state].nextState;
        iVar15 = iVar15 + (uint)seqState.stateML.table[seqState.stateML.state].nbBits;
        seqState.stateML.state =
             (ulong)((uint)(seqState.DStream.bitContainer >> ((ulong)(byte)-(char)iVar15 & 0x3f)) &
                    BIT_mask[seqState.stateML.table[seqState.stateML.state].nbBits]) +
             (ulong)seqState.stateML.table[seqState.stateML.state].nextState;
        seqState.DStream.bitsConsumed =
             iVar15 + (uint)seqState.stateOffb.table[seqState.stateOffb.state].nbBits;
        seqState.stateOffb.state =
             (ulong)((uint)(seqState.DStream.bitContainer >>
                           ((ulong)(byte)-(char)seqState.DStream.bitsConsumed & 0x3f)) &
                    BIT_mask[seqState.stateOffb.table[seqState.stateOffb.state].nbBits]) +
             (ulong)seqState.stateOffb.table[seqState.stateOffb.state].nextState;
        pBStackY_170 = (BYTE *)(uVar12 + sStack_48);
        pBVar1 = op_00 + (long)pBStackY_170;
        if (oend_00 < pBVar1) goto LAB_0013ba59;
        pBVar14 = litPtr + uVar12;
        if (litLimit < pBVar14) goto LAB_0013b9fa;
        pBVar17 = op_00 + uVar12;
        if (local_f0 < pBVar17) {
          sequence.matchLength = sStack_48;
          sequence.litLength = uVar12;
          sequence.offset = sVar11;
          sequence.match = pBStack_38;
          pBStackY_170 = (BYTE *)ZSTD_execSequenceLast7
                                           (op_00,oend_00,sequence,&litPtr,litLimit,base,local_f8,
                                            local_100);
        }
        else {
          *(undefined8 *)op_00 = *(undefined8 *)litPtr;
          if (8 < uVar12) {
            pBVar13 = op_00 + 8;
            do {
              litPtr = litPtr + 8;
              *(undefined8 *)pBVar13 = *(undefined8 *)litPtr;
              pBVar13 = pBVar13 + 8;
            } while (pBVar13 < pBVar17);
          }
          pBVar13 = pBVar17 + -sVar11;
          litPtr = pBVar14;
          if ((ulong)((long)pBVar17 - (long)base) < sVar11) {
            if ((ulong)((long)pBVar17 - (long)local_f8) < sVar11) goto LAB_0013b9fa;
            lVar10 = (long)(pBVar17 + -sVar11) - (long)base;
            pBVar14 = local_100 + lVar10;
            if (local_100 < pBVar14 + sStack_48) {
              memmove(pBVar17,pBVar14,-lVar10);
              pBVar17 = pBVar17 + -lVar10;
              sStack_48 = sStack_48 + lVar10;
              if ((pBVar17 <= local_f0) && (pBVar13 = base, 2 < sStack_48)) goto LAB_0013b8bc;
              for (uVar9 = 0; uVar18 = (ulong)uVar9, uVar18 < sStack_48; uVar9 = uVar9 + 1) {
                pBVar17[uVar18] = base[uVar18];
              }
            }
            else {
              memmove(pBVar17,pBVar14,sStack_48);
            }
          }
          else {
LAB_0013b8bc:
            if (sVar11 < 8) {
              iVar15 = *(int *)(ZSTD_execSequence_dec64table + sVar11 * 4);
              *pBVar17 = *pBVar13;
              pBVar17[1] = pBVar13[1];
              pBVar17[2] = pBVar13[2];
              pBVar17[3] = pBVar13[3];
              pBVar14 = pBVar13 + *(uint *)(ZSTD_execSequence_dec32table + sVar11 * 4);
              pBVar13 = pBVar13 + ((ulong)*(uint *)(ZSTD_execSequence_dec32table + sVar11 * 4) -
                                  (long)iVar15);
              *(undefined4 *)(pBVar17 + 4) = *(undefined4 *)pBVar14;
            }
            else {
              *(undefined8 *)pBVar17 = *(undefined8 *)pBVar13;
            }
            pBVar14 = pBVar17 + 8;
            pBVar13 = pBVar13 + 8;
            if (oend_00 + -0xd < pBVar1) {
              pBVar17 = pBVar14;
              pBVar16 = pBVar13;
              if (pBVar14 < local_f0) {
                do {
                  *(undefined8 *)pBVar17 = *(undefined8 *)pBVar16;
                  pBVar17 = pBVar17 + 8;
                  pBVar16 = pBVar16 + 8;
                } while (pBVar17 < local_f0);
                pBVar13 = pBVar13 + ((long)local_f0 - (long)pBVar14);
                pBVar14 = local_f0;
              }
              for (; pBVar14 < pBVar1; pBVar14 = pBVar14 + 1) {
                BVar4 = *pBVar13;
                pBVar13 = pBVar13 + 1;
                *pBVar14 = BVar4;
              }
            }
            else {
              do {
                *(undefined8 *)pBVar14 = *(undefined8 *)pBVar13;
                pBVar14 = pBVar14 + 8;
                pBVar13 = pBVar13 + 8;
              } while (pBVar14 < pBVar17 + sStack_48);
            }
          }
        }
        op_00 = op_00 + (long)pBStackY_170;
        nbSeq = nbSeq + -1;
      } while (pBStackY_170 < (BYTE *)0xffffffffffffff89);
    }
    else {
LAB_0013b9fa:
      pBStackY_170 = (BYTE *)0xffffffffffffffec;
    }
  }
  return (size_t)pBStackY_170;
}

Assistant:

size_t
ZSTD_decompressSequences_bmi2(ZSTD_DCtx* dctx,
                                 void* dst, size_t maxDstSize,
                           const void* seqStart, size_t seqSize, int nbSeq,
                           const ZSTD_longOffset_e isLongOffset)
{
    return ZSTD_decompressSequences_body(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset);
}